

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gdsCpp.hpp
# Opt level: O2

void __thiscall gdsTEXT::gdsTEXT(gdsTEXT *this)

{
  allocator<char> local_1a;
  allocator<char> local_19;
  
  this->plex = 0;
  (this->presentation_flags).super__Base_bitset<1UL>._M_w = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->textbody,"",&local_19);
  (this->text_transformation_flags).super__Base_bitset<1UL>._M_w = 0;
  this->layer = 0;
  this->text_type = 0;
  this->path_type = 0;
  this->width = 0;
  this->scale = 1.0;
  this->angle = 0.0;
  this->xCor = 0;
  this->yCor = 0;
  this->propattr = 0;
  std::__cxx11::string::string<std::allocator<char>>((string *)&this->propvalue,"",&local_1a);
  return;
}

Assistant:

gdsTEXT(){}